

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

int generate_code(string *language,string *input_file_path,string *out_path)

{
  pointer pcVar1;
  t_program *this;
  uint uVar2;
  string input_file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  generator_strings;
  string old_thrift_include_path;
  time_t now;
  string old_input_file;
  string new_thrift_include_path;
  undefined1 *local_118;
  long local_110;
  undefined1 local_108 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  string local_d8;
  string local_b8;
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88 [16];
  time_t local_78;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  local_78 = time((time_t *)0x0);
  g_time_str = ctime(&local_78);
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98 = local_88;
  local_90 = 0;
  local_88[0] = 0;
  local_48 = 0;
  local_40[0] = 0;
  local_68 = 0;
  local_60[0] = 0;
  local_70 = local_60;
  local_50 = local_40;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_f8,language
            );
  initGlobals();
  pcVar1 = (input_file_path->_M_dataplus)._M_p;
  local_118 = local_108;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,pcVar1,pcVar1 + input_file_path->_M_string_length);
  this = (t_program *)operator_new(0x238);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_118,local_118 + local_110);
  t_program::t_program(this,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (out_path->_M_string_length != 0) {
    pcVar1 = (out_path->_M_dataplus)._M_p;
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,pcVar1,pcVar1 + out_path->_M_string_length);
    t_program::set_out_path(this,&local_d8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
  }
  parse(this,(t_program *)0x0);
  std::__cxx11::string::_M_replace
            (0x4141e0,0,(char *)g_curpath_abi_cxx11_._M_string_length,0x377c77);
  yylineno = 1;
  generate(this,&local_f8);
  (*(this->super_t_doc)._vptr_t_doc[1])(this);
  clearGlobals();
  if ((g_return_failure != true) || (uVar2 = 1, g_audit_fatal == false)) {
    uVar2 = (uint)g_generator_failure;
  }
  if (local_118 != local_108) {
    operator_delete(local_118);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_98 != local_88) {
    operator_delete(local_98);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  return uVar2;
}

Assistant:

int generate_code(string language, string input_file_path, string out_path) {
    int i;
//    std::string out_path;
//    out_path = "/Users/hezhaozhao/akulaku/test/thrift/compiler/cpp";
    bool out_path_is_absolute = false;

    // Setup time string
    time_t now = time(nullptr);
    g_time_str = ctime(&now);

    // Check for necessary arguments, you gotta have at least a filename and
    // an output language flag
    vector<string> generator_strings;
    string old_thrift_include_path;
    string new_thrift_include_path;
    string old_input_file;
//    std:string aa = "py";
    generator_strings.emplace_back(language);
    initGlobals();
//    string input_file_path = "/Users/hezhaozhao/akulaku/test/thrift/compiler/cpp/text1.thrift";
    string input_file(input_file_path); // start

    // Instance of the global parse tree
    t_program *program = new t_program(input_file);
    if (out_path.size()) {
        program->set_out_path(out_path, out_path_is_absolute);
    }

    // Compute the cpp include prefix.
    // infer this from the filename passed in
//    string input_filename = argv[i];
//    string include_prefix;
//
//    string::size_type last_slash = string::npos;
//    if ((last_slash = input_filename.rfind("/")) != string::npos) {
//        include_prefix = input_filename.substr(0, last_slash);
//    }
//
//    program->set_include_prefix(include_prefix);

    // Parse it!
    parse(program, nullptr);

    // The current path is not really relevant when we are doing generation.
    // Reset the variable to make warning messages clearer.
    g_curpath = "generation";
    // Reset yylineno for the heck of it.  Use 1 instead of 0 because
    // That is what shows up during argument parsing.
    yylineno = 1;

    // Generate it!
    generate(program, generator_strings);
    delete program;

    clearGlobals();

    // Finished
    if (g_return_failure && g_audit_fatal) {
        return 1;
    }
    if (g_generator_failure) {
        return 1;
    }
    // Finished
    return 0;
}